

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::TanH_x86_avx::forward_inplace(TanH_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [24];
  undefined1 auVar33 [16];
  long *in_RSI;
  float fVar34;
  float fVar35;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 two;
  __m256 one;
  __m128 two_1;
  __m128 one_3;
  __m256 one_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one_2;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 one_4;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_5;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined8 local_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  int local_16f8;
  undefined8 local_16e8;
  undefined8 local_16e0;
  undefined8 local_16d8;
  undefined4 local_16d0;
  long local_16c8;
  undefined4 local_16c0;
  undefined4 local_16bc;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 local_16b0;
  undefined8 local_16a8;
  undefined1 (*local_16a0) [32];
  int local_1694;
  int local_1690;
  int local_168c;
  int local_1688;
  int local_1684;
  int local_1680;
  int local_167c;
  long *local_1670;
  undefined1 local_165d;
  int local_165c;
  undefined8 *local_1650;
  undefined8 *local_1648;
  undefined8 *local_1638;
  undefined1 (*local_1628) [32];
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined1 (*local_1590) [32];
  undefined1 (*local_1588) [32];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 local_1550;
  undefined8 uStack_1548;
  undefined1 (*local_1540) [32];
  long local_1538;
  undefined4 local_152c;
  long local_1528;
  undefined1 (*local_1520) [32];
  undefined4 local_1514;
  int local_1510;
  int local_150c;
  undefined8 *local_1508;
  undefined4 local_14fc;
  long local_14f8;
  undefined8 *local_14d8;
  undefined4 local_14a8;
  undefined4 local_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_1480 [32];
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined1 local_1440 [8];
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  undefined4 uStack_13a4;
  undefined4 local_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  ulong uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1340 [16];
  undefined1 auStack_1330 [16];
  undefined4 local_1320;
  undefined4 local_131c;
  undefined4 local_1318;
  undefined4 local_1314;
  undefined4 local_1310;
  undefined4 local_130c;
  undefined4 local_1308;
  undefined4 local_1304;
  undefined1 local_1300 [16];
  undefined1 auStack_12f0 [16];
  undefined4 local_12e0;
  undefined4 local_12dc;
  undefined4 local_12d8;
  undefined4 local_12d4;
  undefined4 local_12d0;
  undefined4 local_12cc;
  undefined4 local_12c8;
  undefined4 local_12c4;
  undefined1 local_12c0 [16];
  undefined1 auStack_12b0 [16];
  undefined4 local_12a0;
  undefined4 local_129c;
  undefined4 local_1298;
  undefined4 local_1294;
  undefined4 local_1290;
  undefined4 local_128c;
  undefined4 local_1288;
  undefined4 local_1284;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined1 local_1260 [32];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined1 local_1220 [8];
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined1 local_11c0 [32];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined1 local_1160 [8];
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [32];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 local_10a0 [32];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined1 *local_f38;
  undefined8 *local_f30;
  float *local_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  float *local_e98;
  undefined1 *local_e90;
  float *local_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  float local_e40 [2];
  float afStack_e38 [2];
  float afStack_e30 [2];
  float afStack_e28 [2];
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  float fStack_e04;
  float *local_df8;
  undefined1 *local_df0;
  float *local_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  float local_da0 [2];
  float afStack_d98 [2];
  float afStack_d90 [2];
  float afStack_d88 [2];
  float local_d80;
  float fStack_d7c;
  float fStack_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float fStack_d68;
  float fStack_d64;
  float *local_d58;
  undefined1 *local_d50;
  float *local_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  float local_d00 [2];
  float afStack_cf8 [2];
  float afStack_cf0 [2];
  float afStack_ce8 [2];
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  float *local_cb8;
  undefined1 *local_cb0;
  float *local_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60 [2];
  float afStack_c58 [2];
  float afStack_c50 [2];
  float afStack_c48 [2];
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  float *local_c18;
  undefined1 *local_c10;
  float *local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  float local_bc0 [2];
  float afStack_bb8 [2];
  float afStack_bb0 [2];
  float afStack_ba8 [2];
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float *local_b78;
  float *local_b70;
  undefined1 *local_b68;
  float local_b60 [2];
  float afStack_b58 [2];
  float afStack_b50 [2];
  float afStack_b48 [2];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  float local_b20 [2];
  float afStack_b18 [2];
  float afStack_b10 [2];
  float afStack_b08 [2];
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  undefined4 uStack_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined1 *local_a98;
  float *local_a90;
  undefined1 *local_a88;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  float local_a40 [2];
  float afStack_a38 [2];
  float afStack_a30 [2];
  float afStack_a28 [2];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 *local_9f8;
  float *local_9f0;
  undefined1 *local_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0 [2];
  float afStack_998 [2];
  float afStack_990 [2];
  float afStack_988 [2];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined4 local_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined4 local_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined4 local_6e4;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined4 local_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 uStack_6ac;
  undefined4 uStack_6a8;
  undefined4 uStack_6a4;
  undefined4 local_694;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined1 local_680 [16];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined4 local_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined4 local_5f4;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  ulong uStack_5d8;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520 [16];
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined4 local_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 *local_338;
  float *local_330;
  undefined1 *local_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2d8;
  float *local_2d0;
  undefined1 *local_2c8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 *local_278;
  undefined8 *local_270;
  float *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float *local_218;
  undefined1 *local_210;
  float *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float *local_1b8;
  undefined1 *local_1b0;
  float *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_180 [2];
  float afStack_178 [2];
  float local_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float *local_158;
  undefined1 *local_150;
  float *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float *local_f8;
  undefined1 *local_f0;
  float *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  float local_c0 [2];
  float afStack_b8 [2];
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float *local_98;
  undefined1 *local_90;
  float *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  float local_60 [2];
  float afStack_58 [2];
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_167c = *(int *)((long)in_RSI + 0x2c);
  local_1680 = (int)in_RSI[6];
  local_1684 = *(int *)((long)in_RSI + 0x34);
  local_1688 = (int)in_RSI[7];
  local_168c = (int)in_RSI[3];
  local_1690 = local_167c * local_1680 * local_1684 * local_168c;
  local_1670 = in_RSI;
  for (local_1694 = 0; local_1694 < local_1688; local_1694 = local_1694 + 1) {
    local_1650 = &local_16e8;
    local_150c = *(int *)((long)local_1670 + 0x2c);
    local_1510 = (int)local_1670[6];
    local_1514 = *(undefined4 *)((long)local_1670 + 0x34);
    local_1520 = (undefined1 (*) [32])
                 (*local_1670 + local_1670[8] * (long)local_1694 * local_1670[2]);
    local_1528 = local_1670[2];
    local_152c = (undefined4)local_1670[3];
    local_1538 = local_1670[4];
    local_1508 = &local_16e8;
    local_14f8 = (long)local_150c * (long)local_1510 * local_1528;
    local_1648 = &local_16e8;
    local_1638 = &local_16e8;
    local_14fc = 0x10;
    local_165c = local_1694;
    local_165d = 1;
    local_16e8 = 0;
    local_16d8 = 0;
    local_16d0 = 0;
    local_16c0 = 0;
    local_16bc = 0;
    local_16b8 = 0;
    local_16b4 = 0;
    local_16b0 = 0;
    local_16a8 = 0;
    local_16e0 = 0;
    local_16a0 = local_1520;
    for (local_16f8 = 0; local_16f8 + 7 < local_1690; local_16f8 = local_16f8 + 8) {
      local_1628 = local_16a0;
      auVar32 = *(undefined1 (*) [24])*local_16a0;
      uStack_15c8 = *(undefined8 *)(*local_16a0 + 0x18);
      local_1720 = auVar32._0_8_;
      local_15e0 = local_1720;
      uStack_1718 = auVar32._8_8_;
      uStack_15d8 = uStack_1718;
      uStack_1710 = auVar32._16_8_;
      uStack_15d0 = uStack_1710;
      local_14a4 = 0x3f800000;
      local_12e0 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_1300 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_12f0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_1600 = local_1300._0_8_;
      uStack_15f8 = local_1300._8_8_;
      uStack_15f0 = auStack_12f0._0_8_;
      uStack_15e8 = auStack_12f0._8_8_;
      local_14a8 = 0x40000000;
      local_12a0 = 0x40000000;
      auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
      local_12c0 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
      auStack_12b0 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
      local_1620 = local_12c0._0_8_;
      uStack_1618 = local_12c0._8_8_;
      uStack_1610 = auStack_12b0._0_8_;
      uStack_1608 = auStack_12b0._8_8_;
      uVar7 = local_1720;
      uVar8 = uStack_1718;
      uVar9 = uStack_1710;
      local_1400._0_4_ = auVar32._0_4_;
      local_1400._4_4_ = auVar32._4_4_;
      uStack_13f8._0_4_ = auVar32._8_4_;
      uStack_13f8._4_4_ = auVar32._12_4_;
      uStack_13f0._0_4_ = auVar32._16_4_;
      uStack_13f0._4_4_ = auVar32._20_4_;
      uStack_13e8._0_4_ = (float)uStack_15c8;
      uStack_13e8._4_4_ = (undefined4)((ulong)uStack_15c8 >> 0x20);
      uStack_13a4 = uStack_13e8._4_4_;
      local_1420._0_4_ = local_12c0._0_4_;
      local_1420._4_4_ = local_12c0._4_4_;
      uStack_1418._0_4_ = local_12c0._8_4_;
      uStack_1418._4_4_ = local_12c0._12_4_;
      uStack_1410._0_4_ = auStack_12b0._0_4_;
      uStack_1410._4_4_ = auStack_12b0._4_4_;
      uStack_1408._0_4_ = auStack_12b0._8_4_;
      local_13c0 = (float)local_1400 * (float)local_1420;
      fStack_13bc = local_1400._4_4_ * local_1420._4_4_;
      fStack_13b8 = (float)uStack_13f8 * (float)uStack_1418;
      fStack_13b4 = uStack_13f8._4_4_ * uStack_1418._4_4_;
      fStack_13b0 = (float)uStack_13f0 * (float)uStack_1410;
      fStack_13ac = uStack_13f0._4_4_ * uStack_1410._4_4_;
      fStack_13a8 = (float)uStack_13e8 * (float)uStack_1408;
      local_1384 = 0x3f800000;
      local_1320 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_1340 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_1330 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_13e0 = local_1340._0_8_;
      uStack_13d8 = local_1340._8_8_;
      uStack_13d0 = auStack_1330._0_8_;
      uStack_13c8 = auStack_1330._8_8_;
      local_1260._16_8_ = auStack_1330._0_8_;
      local_1260._0_16_ = local_1340;
      local_1260._24_8_ = auStack_1330._8_8_;
      local_1000 = ZEXT832(0) << 0x20;
      local_1360 = 0;
      local_fe0._8_8_ = SUB328(ZEXT832(0),4);
      uStack_1358 = local_fe0._8_8_;
      uStack_1350 = 0;
      uStack_1348 = 0;
      local_1380 = CONCAT44(fStack_13bc,local_13c0);
      uStack_1378 = CONCAT44(fStack_13b4,fStack_13b8);
      uStack_1370 = CONCAT44(fStack_13ac,fStack_13b0);
      uStack_1368 = CONCAT44(uStack_13e8._4_4_,fStack_13a8);
      auVar4._8_8_ = uStack_1378;
      auVar4._0_8_ = local_1380;
      auVar4._16_8_ = uStack_1370;
      auVar4._24_8_ = uStack_1368;
      auVar6 = vsubps_avx(ZEXT832((ulong)local_fe0._8_8_) << 0x40,auVar4);
      local_11a0 = 0x3f8000003f800000;
      uStack_1198 = 0x3f8000003f800000;
      uStack_1190 = 0x3f8000003f800000;
      uStack_1188 = 0x3f8000003f800000;
      local_1120._0_8_ = auVar6._0_8_;
      local_fa0 = local_1120._0_8_;
      local_1120._8_8_ = auVar6._8_8_;
      uStack_f98 = local_1120._8_8_;
      local_1120._16_8_ = auVar6._16_8_;
      uStack_f90 = local_1120._16_8_;
      local_1120._24_8_ = auVar6._24_8_;
      uStack_f88 = local_1120._24_8_;
      local_fc0 = 0x42b0c0a542b0c0a5;
      uStack_fb8 = 0x42b0c0a542b0c0a5;
      uStack_fb0 = 0x42b0c0a542b0c0a5;
      uStack_fa8 = 0x42b0c0a542b0c0a5;
      auVar14._8_8_ = 0x42b0c0a542b0c0a5;
      auVar14._0_8_ = 0x42b0c0a542b0c0a5;
      auVar14._16_8_ = 0x42b0c0a542b0c0a5;
      auVar14._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar6,auVar14);
      local_1120._0_8_ = auVar6._0_8_;
      local_f60 = local_1120._0_8_;
      local_1120._8_8_ = auVar6._8_8_;
      uStack_f58 = local_1120._8_8_;
      local_1120._16_8_ = auVar6._16_8_;
      uStack_f50 = local_1120._16_8_;
      local_1120._24_8_ = auVar6._24_8_;
      uStack_f48 = local_1120._24_8_;
      local_f80 = 0xc2b0c0a5c2b0c0a5;
      uStack_f78 = 0xc2b0c0a5c2b0c0a5;
      uStack_f70 = 0xc2b0c0a5c2b0c0a5;
      uStack_f68 = 0xc2b0c0a5c2b0c0a5;
      auVar15._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar15._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar15._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar15._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar6,auVar15);
      local_f38 = local_1120;
      local_b70 = ::_ps256_cephes_LOG2EF;
      local_b78 = ::_ps256_0p5;
      local_1120._0_8_ = auVar4._0_8_;
      uVar10 = local_1120._0_8_;
      local_1120._8_8_ = auVar4._8_8_;
      uVar11 = local_1120._8_8_;
      local_1120._16_8_ = auVar4._16_8_;
      uVar12 = local_1120._16_8_;
      local_1120._24_8_ = auVar4._24_8_;
      uVar13 = local_1120._24_8_;
      local_b60[0] = 1.442695;
      local_b60[1] = 1.442695;
      afStack_b58[0] = 1.442695;
      afStack_b58[1] = 1.442695;
      afStack_b50[0] = 1.442695;
      afStack_b50[1] = 1.442695;
      afStack_b48[0] = 1.442695;
      afStack_b48[1] = 1.442695;
      local_b40._0_4_ = auVar4._0_4_;
      local_b40._4_4_ = auVar4._4_4_;
      uStack_b38._0_4_ = auVar4._8_4_;
      uStack_b38._4_4_ = auVar4._12_4_;
      uStack_b30._0_4_ = auVar4._16_4_;
      uStack_b30._4_4_ = auVar4._20_4_;
      uStack_b28._0_4_ = auVar4._24_4_;
      uStack_ae4 = 0x3fb8aa3b;
      local_b00 = (float)local_b40 * 1.442695;
      fStack_afc = local_b40._4_4_ * 1.442695;
      fStack_af8 = (float)uStack_b38 * 1.442695;
      fStack_af4 = uStack_b38._4_4_ * 1.442695;
      fStack_af0 = (float)uStack_b30 * 1.442695;
      fStack_aec = uStack_b30._4_4_ * 1.442695;
      fStack_ae8 = (float)uStack_b28 * 1.442695;
      local_b20[0] = 0.5;
      local_b20[1] = 0.5;
      afStack_b18[0] = 0.5;
      afStack_b18[1] = 0.5;
      afStack_b10[0] = 0.5;
      afStack_b10[1] = 0.5;
      afStack_b08[0] = 0.5;
      afStack_b08[1] = 0.5;
      local_1160._4_4_ = fStack_afc + 0.5;
      local_1160._0_4_ = local_b00 + 0.5;
      uStack_1158._0_4_ = fStack_af8 + 0.5;
      uStack_1158._4_4_ = fStack_af4 + 0.5;
      uStack_1150._0_4_ = fStack_af0 + 0.5;
      uStack_1150._4_4_ = fStack_aec + 0.5;
      uStack_1148._0_4_ = fStack_ae8 + 0.5;
      uStack_1148._4_4_ = 0x3ff8aa3b;
      auVar5 = vroundps_avx(_local_1160,1);
      auVar6 = vcmpps_avx(_local_1160,auVar5,1);
      local_11c0._0_8_ = auVar6._0_8_;
      local_ac0 = local_11c0._0_8_;
      local_11c0._8_8_ = auVar6._8_8_;
      uStack_ab8 = local_11c0._8_8_;
      local_11c0._16_8_ = auVar6._16_8_;
      uStack_ab0 = local_11c0._16_8_;
      local_11c0._24_8_ = auVar6._24_8_;
      uStack_aa8 = local_11c0._24_8_;
      local_ae0 = 0x3f8000003f800000;
      uStack_ad8 = 0x3f8000003f800000;
      uStack_ad0 = 0x3f8000003f800000;
      uStack_ac8 = 0x3f8000003f800000;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._16_8_ = 0x3f8000003f800000;
      auVar16._24_8_ = 0x3f8000003f800000;
      local_11c0 = vandps_avx(auVar6,auVar16);
      local_1140 = auVar5._0_8_;
      local_10e0 = local_1140;
      uStack_1138 = auVar5._8_8_;
      uStack_10d8 = uStack_1138;
      uStack_1130 = auVar5._16_8_;
      uStack_10d0 = uStack_1130;
      uStack_1128 = auVar5._24_8_;
      uStack_10c8 = uStack_1128;
      local_1100 = local_11c0._0_8_;
      uStack_10f8 = local_11c0._8_8_;
      uStack_10f0 = local_11c0._16_8_;
      uStack_10e8 = local_11c0._24_8_;
      _local_1160 = vsubps_avx(auVar5,local_11c0);
      local_a88 = local_1160;
      local_9f0 = ::_ps256_cephes_exp_C1;
      local_9c0 = local_1120._0_8_;
      uStack_9b8 = local_1120._8_8_;
      uStack_9b0 = local_1120._16_8_;
      uStack_9a8 = local_1120._24_8_;
      local_9a0[0] = 0.6933594;
      local_9a0[1] = 0.6933594;
      afStack_998[0] = 0.6933594;
      afStack_998[1] = 0.6933594;
      afStack_990[0] = 0.6933594;
      afStack_990[1] = 0.6933594;
      afStack_988[0] = 0.6933594;
      afStack_988[1] = 0.6933594;
      local_980._0_4_ = local_1160._0_4_;
      local_980._4_4_ = local_1160._4_4_;
      uStack_978._0_4_ = local_1160._8_4_;
      uStack_978._4_4_ = local_1160._12_4_;
      uStack_970._0_4_ = local_1160._16_4_;
      uStack_970._4_4_ = local_1160._20_4_;
      uStack_968._0_4_ = local_1160._24_4_;
      uStack_968._4_4_ = local_1160._28_4_;
      fStack_9c4 = uStack_968._4_4_;
      local_9e0 = (float)local_980 * 0.6933594;
      fStack_9dc = local_980._4_4_ * 0.6933594;
      fStack_9d8 = (float)uStack_978 * 0.6933594;
      fStack_9d4 = uStack_978._4_4_ * 0.6933594;
      fStack_9d0 = (float)uStack_970 * 0.6933594;
      fStack_9cc = uStack_970._4_4_ * 0.6933594;
      fStack_9c8 = (float)uStack_968 * 0.6933594;
      auVar18._4_4_ = fStack_9dc;
      auVar18._0_4_ = local_9e0;
      auVar18._8_4_ = fStack_9d8;
      auVar18._12_4_ = fStack_9d4;
      auVar18._16_4_ = fStack_9d0;
      auVar18._20_4_ = fStack_9cc;
      auVar18._24_4_ = fStack_9c8;
      auVar18._28_4_ = uStack_968._4_4_;
      auVar6 = vsubps_avx(auVar4,auVar18);
      local_a90 = ::_ps256_cephes_exp_C2;
      local_1120._0_8_ = auVar6._0_8_;
      local_a60 = local_1120._0_8_;
      local_1120._8_8_ = auVar6._8_8_;
      uStack_a58 = local_1120._8_8_;
      local_1120._16_8_ = auVar6._16_8_;
      uStack_a50 = local_1120._16_8_;
      local_1120._24_8_ = auVar6._24_8_;
      uStack_a48 = local_1120._24_8_;
      local_a20 = local_1160;
      uStack_a18 = uStack_1158;
      uStack_a10 = uStack_1150;
      uStack_a08 = uStack_1148;
      local_a40[0] = -0.00021219444;
      local_a40[1] = -0.00021219444;
      afStack_a38[0] = -0.00021219444;
      afStack_a38[1] = -0.00021219444;
      afStack_a30[0] = -0.00021219444;
      afStack_a30[1] = -0.00021219444;
      afStack_a28[0] = -0.00021219444;
      afStack_a28[1] = -0.00021219444;
      fStack_a64 = uStack_968._4_4_;
      local_a80 = (float)local_980 * -0.00021219444;
      fStack_a7c = local_980._4_4_ * -0.00021219444;
      fStack_a78 = (float)uStack_978 * -0.00021219444;
      fStack_a74 = uStack_978._4_4_ * -0.00021219444;
      fStack_a70 = (float)uStack_970 * -0.00021219444;
      fStack_a6c = uStack_970._4_4_ * -0.00021219444;
      fStack_a68 = (float)uStack_968 * -0.00021219444;
      auVar17._4_4_ = fStack_a7c;
      auVar17._0_4_ = local_a80;
      auVar17._8_4_ = fStack_a78;
      auVar17._12_4_ = fStack_a74;
      auVar17._16_4_ = fStack_a70;
      auVar17._20_4_ = fStack_a6c;
      auVar17._24_4_ = fStack_a68;
      auVar17._28_4_ = uStack_968._4_4_;
      local_1120 = vsubps_avx(auVar6,auVar17);
      local_1080 = local_1120._0_8_;
      uStack_1078 = local_1120._8_8_;
      uStack_1070 = local_1120._16_8_;
      uStack_1068 = local_1120._24_8_;
      local_1060._0_4_ = local_1120._0_4_;
      local_1060._4_4_ = local_1120._4_4_;
      uStack_1058._0_4_ = local_1120._8_4_;
      uStack_1058._4_4_ = local_1120._12_4_;
      uStack_1050._0_4_ = local_1120._16_4_;
      uStack_1050._4_4_ = local_1120._20_4_;
      uStack_1048._0_4_ = local_1120._24_4_;
      uStack_1048._4_4_ = local_1120._28_4_;
      local_1140 = CONCAT44(local_1060._4_4_ * local_1060._4_4_,
                            (float)local_1060 * (float)local_1060);
      uStack_1138._0_4_ = (float)uStack_1058 * (float)uStack_1058;
      uStack_1138._4_4_ = uStack_1058._4_4_ * uStack_1058._4_4_;
      uStack_1130._0_4_ = (float)uStack_1050 * (float)uStack_1050;
      uStack_1130._4_4_ = uStack_1050._4_4_ * uStack_1050._4_4_;
      auVar32 = _local_1140;
      uStack_1128._0_4_ = (float)uStack_1048 * (float)uStack_1048;
      uStack_1128._4_4_ = uStack_1048._4_4_;
      auVar4 = _local_1140;
      local_f28 = &local_11e0;
      local_c18 = ::_ps256_cephes_exp_p1;
      local_be0 = 0x3950696739506967;
      uStack_bd8 = 0x3950696739506967;
      uStack_bd0 = 0x3950696739506967;
      uStack_bc8 = 0x3950696739506967;
      local_c00 = local_1120._0_8_;
      uStack_bf8 = local_1120._8_8_;
      uStack_bf0 = local_1120._16_8_;
      uStack_be8 = local_1120._24_8_;
      fStack_b84 = uStack_1048._4_4_;
      local_ba0 = (float)local_1060 * 0.00019875691;
      fStack_b9c = local_1060._4_4_ * 0.00019875691;
      fStack_b98 = (float)uStack_1058 * 0.00019875691;
      fStack_b94 = uStack_1058._4_4_ * 0.00019875691;
      fStack_b90 = (float)uStack_1050 * 0.00019875691;
      fStack_b8c = uStack_1050._4_4_ * 0.00019875691;
      fStack_b88 = (float)uStack_1048 * 0.00019875691;
      local_bc0[0] = 0.0013981999;
      local_bc0[1] = 0.0013981999;
      afStack_bb8[0] = 0.0013981999;
      afStack_bb8[1] = 0.0013981999;
      afStack_bb0[0] = 0.0013981999;
      afStack_bb0[1] = 0.0013981999;
      afStack_ba8[0] = 0.0013981999;
      afStack_ba8[1] = 0.0013981999;
      local_cb8 = ::_ps256_cephes_exp_p2;
      local_c80 = CONCAT44(fStack_b9c + 0.0013981999,local_ba0 + 0.0013981999);
      uStack_c78 = CONCAT44(fStack_b94 + 0.0013981999,fStack_b98 + 0.0013981999);
      uStack_c70 = CONCAT44(fStack_b8c + 0.0013981999,fStack_b90 + 0.0013981999);
      uStack_c68 = CONCAT44(uStack_1048._4_4_ + 0.0013981999,fStack_b88 + 0.0013981999);
      local_ca0 = local_1120._0_8_;
      uStack_c98 = local_1120._8_8_;
      uStack_c90 = local_1120._16_8_;
      uStack_c88 = local_1120._24_8_;
      fStack_c24 = uStack_1048._4_4_;
      local_c40 = (local_ba0 + 0.0013981999) * (float)local_1060;
      fStack_c3c = (fStack_b9c + 0.0013981999) * local_1060._4_4_;
      fStack_c38 = (fStack_b98 + 0.0013981999) * (float)uStack_1058;
      fStack_c34 = (fStack_b94 + 0.0013981999) * uStack_1058._4_4_;
      fStack_c30 = (fStack_b90 + 0.0013981999) * (float)uStack_1050;
      fStack_c2c = (fStack_b8c + 0.0013981999) * uStack_1050._4_4_;
      fStack_c28 = (fStack_b88 + 0.0013981999) * (float)uStack_1048;
      local_c60[0] = 0.008333452;
      local_c60[1] = 0.008333452;
      afStack_c58[0] = 0.008333452;
      afStack_c58[1] = 0.008333452;
      afStack_c50[0] = 0.008333452;
      afStack_c50[1] = 0.008333452;
      afStack_c48[0] = 0.008333452;
      afStack_c48[1] = 0.008333452;
      local_d58 = ::_ps256_cephes_exp_p3;
      local_d20 = CONCAT44(fStack_c3c + 0.008333452,local_c40 + 0.008333452);
      uStack_d18 = CONCAT44(fStack_c34 + 0.008333452,fStack_c38 + 0.008333452);
      uStack_d10 = CONCAT44(fStack_c2c + 0.008333452,fStack_c30 + 0.008333452);
      uStack_d08 = CONCAT44(uStack_1048._4_4_ + 0.008333452,fStack_c28 + 0.008333452);
      local_d40 = local_1120._0_8_;
      uStack_d38 = local_1120._8_8_;
      uStack_d30 = local_1120._16_8_;
      uStack_d28 = local_1120._24_8_;
      fStack_cc4 = uStack_1048._4_4_;
      local_ce0 = (local_c40 + 0.008333452) * (float)local_1060;
      fStack_cdc = (fStack_c3c + 0.008333452) * local_1060._4_4_;
      fStack_cd8 = (fStack_c38 + 0.008333452) * (float)uStack_1058;
      fStack_cd4 = (fStack_c34 + 0.008333452) * uStack_1058._4_4_;
      fStack_cd0 = (fStack_c30 + 0.008333452) * (float)uStack_1050;
      fStack_ccc = (fStack_c2c + 0.008333452) * uStack_1050._4_4_;
      fStack_cc8 = (fStack_c28 + 0.008333452) * (float)uStack_1048;
      local_d00[0] = 0.041665796;
      local_d00[1] = 0.041665796;
      afStack_cf8[0] = 0.041665796;
      afStack_cf8[1] = 0.041665796;
      afStack_cf0[0] = 0.041665796;
      afStack_cf0[1] = 0.041665796;
      afStack_ce8[0] = 0.041665796;
      afStack_ce8[1] = 0.041665796;
      local_df8 = ::_ps256_cephes_exp_p4;
      local_dc0 = CONCAT44(fStack_cdc + 0.041665796,local_ce0 + 0.041665796);
      uStack_db8 = CONCAT44(fStack_cd4 + 0.041665796,fStack_cd8 + 0.041665796);
      uStack_db0 = CONCAT44(fStack_ccc + 0.041665796,fStack_cd0 + 0.041665796);
      uStack_da8 = CONCAT44(uStack_1048._4_4_ + 0.041665796,fStack_cc8 + 0.041665796);
      local_de0 = local_1120._0_8_;
      uStack_dd8 = local_1120._8_8_;
      uStack_dd0 = local_1120._16_8_;
      uStack_dc8 = local_1120._24_8_;
      fStack_d64 = uStack_1048._4_4_;
      local_d80 = (local_ce0 + 0.041665796) * (float)local_1060;
      fStack_d7c = (fStack_cdc + 0.041665796) * local_1060._4_4_;
      fStack_d78 = (fStack_cd8 + 0.041665796) * (float)uStack_1058;
      fStack_d74 = (fStack_cd4 + 0.041665796) * uStack_1058._4_4_;
      fStack_d70 = (fStack_cd0 + 0.041665796) * (float)uStack_1050;
      fStack_d6c = (fStack_ccc + 0.041665796) * uStack_1050._4_4_;
      fStack_d68 = (fStack_cc8 + 0.041665796) * (float)uStack_1048;
      local_da0[0] = 0.16666666;
      local_da0[1] = 0.16666666;
      afStack_d98[0] = 0.16666666;
      afStack_d98[1] = 0.16666666;
      afStack_d90[0] = 0.16666666;
      afStack_d90[1] = 0.16666666;
      afStack_d88[0] = 0.16666666;
      afStack_d88[1] = 0.16666666;
      local_e98 = ::_ps256_cephes_exp_p5;
      local_e60 = CONCAT44(fStack_d7c + 0.16666666,local_d80 + 0.16666666);
      uStack_e58 = CONCAT44(fStack_d74 + 0.16666666,fStack_d78 + 0.16666666);
      uStack_e50 = CONCAT44(fStack_d6c + 0.16666666,fStack_d70 + 0.16666666);
      uStack_e48 = CONCAT44(uStack_1048._4_4_ + 0.16666666,fStack_d68 + 0.16666666);
      local_e80 = local_1120._0_8_;
      uStack_e78 = local_1120._8_8_;
      uStack_e70 = local_1120._16_8_;
      uStack_e68 = local_1120._24_8_;
      fStack_e04 = uStack_1048._4_4_;
      local_e20 = (local_d80 + 0.16666666) * (float)local_1060;
      fStack_e1c = (fStack_d7c + 0.16666666) * local_1060._4_4_;
      fStack_e18 = (fStack_d78 + 0.16666666) * (float)uStack_1058;
      fStack_e14 = (fStack_d74 + 0.16666666) * uStack_1058._4_4_;
      fStack_e10 = (fStack_d70 + 0.16666666) * (float)uStack_1050;
      fStack_e0c = (fStack_d6c + 0.16666666) * uStack_1050._4_4_;
      fStack_e08 = (fStack_d68 + 0.16666666) * (float)uStack_1048;
      local_e40[0] = 0.5;
      local_e40[1] = 0.5;
      afStack_e38[0] = 0.5;
      afStack_e38[1] = 0.5;
      afStack_e30[0] = 0.5;
      afStack_e30[1] = 0.5;
      afStack_e28[0] = 0.5;
      afStack_e28[1] = 0.5;
      local_f30 = &local_1140;
      local_f00 = CONCAT44(fStack_e1c + 0.5,local_e20 + 0.5);
      uStack_ef8 = CONCAT44(fStack_e14 + 0.5,fStack_e18 + 0.5);
      uStack_ef0 = CONCAT44(fStack_e0c + 0.5,fStack_e10 + 0.5);
      uStack_ee8 = CONCAT44(uStack_1048._4_4_ + 0.5,fStack_e08 + 0.5);
      local_f20 = local_1140;
      uStack_f18 = uStack_1138;
      uStack_1130 = auVar32._16_8_;
      uStack_f10 = uStack_1130;
      uStack_1128 = auVar4._24_8_;
      uStack_f08 = uStack_1128;
      fStack_ea4 = uStack_1048._4_4_;
      local_ec0 = (local_e20 + 0.5) * (float)local_1060 * (float)local_1060;
      fStack_ebc = (fStack_e1c + 0.5) * local_1060._4_4_ * local_1060._4_4_;
      fStack_eb8 = (fStack_e18 + 0.5) * (float)uStack_1058 * (float)uStack_1058;
      fStack_eb4 = (fStack_e14 + 0.5) * uStack_1058._4_4_ * uStack_1058._4_4_;
      fStack_eb0 = (fStack_e10 + 0.5) * (float)uStack_1050 * (float)uStack_1050;
      fStack_eac = (fStack_e0c + 0.5) * uStack_1050._4_4_ * uStack_1050._4_4_;
      fStack_ea8 = (fStack_e08 + 0.5) * (float)uStack_1048 * (float)uStack_1048;
      local_ee0 = local_1120._0_8_;
      uStack_ed8 = local_1120._8_8_;
      uStack_ed0 = local_1120._16_8_;
      uStack_ec8 = local_1120._24_8_;
      local_1020 = CONCAT44(fStack_ebc + local_1060._4_4_,local_ec0 + (float)local_1060);
      uStack_1018 = CONCAT44(fStack_eb4 + uStack_1058._4_4_,fStack_eb8 + (float)uStack_1058);
      uStack_1010 = CONCAT44(fStack_eac + uStack_1050._4_4_,fStack_eb0 + (float)uStack_1050);
      uStack_1008 = CONCAT44(uStack_1048._4_4_ + uStack_1048._4_4_,fStack_ea8 + (float)uStack_1048);
      local_1040 = 0x3f8000003f800000;
      uStack_1038 = 0x3f8000003f800000;
      uStack_1030 = 0x3f8000003f800000;
      uStack_1028 = 0x3f8000003f800000;
      local_11e0 = local_ec0 + (float)local_1060 + 1.0;
      fStack_11dc = fStack_ebc + local_1060._4_4_ + 1.0;
      fStack_11d8 = fStack_eb8 + (float)uStack_1058 + 1.0;
      fStack_11d4 = fStack_eb4 + uStack_1058._4_4_ + 1.0;
      fStack_11d0 = fStack_eb0 + (float)uStack_1050 + 1.0;
      fStack_11cc = fStack_eac + uStack_1050._4_4_ + 1.0;
      fStack_11c8 = fStack_ea8 + (float)uStack_1048 + 1.0;
      fStack_11c4 = uStack_1048._4_4_ + uStack_1048._4_4_ + 1.0;
      local_960 = local_1160;
      uStack_958 = uStack_1158;
      uStack_950 = uStack_1150;
      uStack_948 = uStack_1148;
      local_1180 = CONCAT44((int)local_980._4_4_,(int)(float)local_980);
      uStack_1178 = CONCAT44((int)uStack_978._4_4_,(int)(float)uStack_978);
      uStack_1170 = CONCAT44((int)uStack_970._4_4_,(int)(float)uStack_970);
      uStack_1168 = CONCAT44((int)uStack_968._4_4_,(int)(float)uStack_968);
      local_860 = local_1180;
      uStack_858 = uStack_1178;
      uStack_850 = uStack_1170;
      uStack_848 = uStack_1168;
      local_880 = 0x7f0000007f;
      uStack_878 = 0x7f0000007f;
      uStack_870 = 0x7f0000007f;
      uStack_868 = 0x7f0000007f;
      local_900 = local_1180;
      uStack_8f8 = uStack_1178;
      uStack_8f0 = uStack_1170;
      uStack_8e8 = uStack_1168;
      local_920 = 0x7f0000007f;
      uStack_918 = 0x7f0000007f;
      uStack_910 = 0x7f0000007f;
      uStack_908 = 0x7f0000007f;
      local_8b0 = 0x7f0000007f;
      uStack_8a8 = 0x7f0000007f;
      local_8c0 = 0x7f0000007f;
      uStack_8b8 = 0x7f0000007f;
      local_720 = local_1180;
      uStack_718 = uStack_1178;
      local_730 = 0x7f0000007f;
      uStack_728 = 0x7f0000007f;
      auVar19._8_8_ = uStack_1178;
      auVar19._0_8_ = local_1180;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_890 = vpaddd_avx(auVar19,auVar3);
      local_740 = uStack_1170;
      uStack_738 = uStack_1168;
      local_750 = 0x7f0000007f;
      uStack_748 = 0x7f0000007f;
      auVar1._8_8_ = uStack_1168;
      auVar1._0_8_ = uStack_1170;
      auVar2._8_8_ = 0x7f0000007f;
      auVar2._0_8_ = 0x7f0000007f;
      local_8a0 = vpaddd_avx(auVar1,auVar2);
      local_940 = local_890._0_8_;
      uStack_938 = local_890._8_8_;
      uStack_930 = local_8a0._0_8_;
      uStack_928 = local_8a0._8_8_;
      local_8e0 = local_890._0_8_;
      uStack_8d8 = local_890._8_8_;
      uStack_8d0 = local_8a0._0_8_;
      uStack_8c8 = local_8a0._8_8_;
      local_7a0 = local_890._0_8_;
      uStack_798 = local_890._8_8_;
      uStack_790 = local_8a0._0_8_;
      uStack_788 = local_8a0._8_8_;
      local_7a4 = 0x17;
      local_820 = local_890._0_8_;
      uStack_818 = local_890._8_8_;
      uStack_810 = local_8a0._0_8_;
      uStack_808 = local_8a0._8_8_;
      local_6e0 = local_890._0_8_;
      uStack_6d8 = local_890._8_8_;
      local_6e4 = 0x17;
      local_7c0 = vpslld_avx(local_890,ZEXT416(0x17));
      local_700 = local_8a0._0_8_;
      uStack_6f8 = local_8a0._8_8_;
      local_704 = 0x17;
      local_7d0 = vpslld_avx(local_8a0,ZEXT416(0x17));
      local_840 = local_7c0._0_8_;
      uStack_838 = local_7c0._8_8_;
      uStack_830 = local_7d0._0_8_;
      uStack_828 = local_7d0._8_8_;
      local_800 = local_7c0._0_8_;
      uStack_7f8 = local_7c0._8_8_;
      uStack_7f0 = local_7d0._0_8_;
      uStack_7e8 = local_7d0._8_8_;
      local_1180 = local_7c0._0_8_;
      uStack_1178 = local_7c0._8_8_;
      uStack_1170 = local_7d0._0_8_;
      uStack_1168 = local_7d0._8_8_;
      local_780 = local_7c0._0_8_;
      uStack_778 = local_7c0._8_8_;
      uStack_770 = local_7d0._0_8_;
      uStack_768 = local_7d0._8_8_;
      local_1200 = local_7c0._0_8_;
      uStack_11f8 = local_7c0._8_8_;
      uStack_11f0 = local_7d0._0_8_;
      uStack_11e8 = local_7d0._8_8_;
      local_10a0._4_4_ = fStack_11dc;
      local_10a0._0_4_ = local_11e0;
      local_10a0._8_4_ = fStack_11d8;
      local_10a0._12_4_ = fStack_11d4;
      local_10a0._16_4_ = fStack_11d0;
      local_10a0._20_4_ = fStack_11cc;
      local_10a0._24_4_ = fStack_11c8;
      local_10a0._28_4_ = fStack_11c4;
      local_10c0._0_4_ = local_7c0._0_4_;
      local_10c0._4_4_ = local_7c0._4_4_;
      uStack_10b8._0_4_ = local_7c0._8_4_;
      uStack_10b8._4_4_ = local_7c0._12_4_;
      uStack_10b0._0_4_ = local_7d0._0_4_;
      uStack_10b0._4_4_ = local_7d0._4_4_;
      uStack_10a8._0_4_ = local_7d0._8_4_;
      local_11e0 = local_11e0 * (float)local_10c0;
      fStack_11dc = fStack_11dc * local_10c0._4_4_;
      fStack_11d8 = fStack_11d8 * (float)uStack_10b8;
      fStack_11d4 = fStack_11d4 * uStack_10b8._4_4_;
      fStack_11d0 = fStack_11d0 * (float)uStack_10b0;
      fStack_11cc = fStack_11cc * uStack_10b0._4_4_;
      fStack_11c8 = fStack_11c8 * (float)uStack_10a8;
      local_1240 = CONCAT44(fStack_11dc,local_11e0);
      uStack_1238 = CONCAT44(fStack_11d4,fStack_11d8);
      uStack_1230 = CONCAT44(fStack_11cc,fStack_11d0);
      uStack_1228 = CONCAT44(fStack_11c4,fStack_11c8);
      local_1220._0_4_ = local_1340._0_4_;
      local_1220._4_4_ = local_1340._4_4_;
      fStack_1218 = local_1340._8_4_;
      fStack_1214 = local_1340._12_4_;
      fStack_1210 = auStack_1330._0_4_;
      fStack_120c = auStack_1330._4_4_;
      fStack_1208 = auStack_1330._8_4_;
      fStack_1204 = auStack_1330._12_4_;
      local_1280 = (float)local_1220._0_4_ + local_11e0;
      fStack_127c = (float)local_1220._4_4_ + fStack_11dc;
      fStack_1278 = fStack_1218 + fStack_11d8;
      fStack_1274 = fStack_1214 + fStack_11d4;
      fStack_1270 = fStack_1210 + fStack_11d0;
      fStack_126c = fStack_120c + fStack_11cc;
      fStack_1268 = fStack_1208 + fStack_11c8;
      fStack_1264 = fStack_1204 + fStack_11c4;
      auVar5._4_4_ = fStack_127c;
      auVar5._0_4_ = local_1280;
      auVar5._8_4_ = fStack_1278;
      auVar5._12_4_ = fStack_1274;
      auVar5._16_4_ = fStack_1270;
      auVar5._20_4_ = fStack_126c;
      auVar5._24_4_ = fStack_1268;
      auVar5._28_4_ = fStack_1264;
      _local_1440 = vdivps_avx(local_1260,auVar5);
      local_1460 = local_12c0._0_8_;
      uStack_1458 = local_12c0._8_8_;
      uStack_1450 = auStack_12b0._0_8_;
      uStack_1448 = auStack_12b0._8_8_;
      local_1480._4_4_ = (float)local_1440._4_4_ * local_1420._4_4_;
      local_1480._0_4_ = (float)local_1440._0_4_ * (float)local_1420;
      local_1480._8_4_ = fStack_1438 * (float)uStack_1418;
      local_1480._12_4_ = fStack_1434 * uStack_1418._4_4_;
      local_1480._16_4_ = fStack_1430 * (float)uStack_1410;
      local_1480._20_4_ = fStack_142c * uStack_1410._4_4_;
      local_1480._24_4_ = fStack_1428 * (float)uStack_1408;
      local_1480._28_4_ = local_1440._28_4_;
      local_14a0 = local_1300._0_8_;
      uStack_1498 = local_1300._8_8_;
      uStack_1490 = auStack_12f0._0_8_;
      uStack_1488 = auStack_12f0._8_8_;
      auVar6._16_8_ = auStack_12f0._0_8_;
      auVar6._0_16_ = local_1300;
      auVar6._24_8_ = auStack_12f0._8_8_;
      auVar6 = vsubps_avx(local_1480,auVar6);
      local_1590 = local_16a0;
      local_1720 = auVar6._0_8_;
      local_15c0 = local_1720;
      uStack_1718 = auVar6._8_8_;
      uStack_15b8 = uStack_1718;
      uStack_1710 = auVar6._16_8_;
      uStack_15b0 = uStack_1710;
      uStack_1708 = auVar6._24_8_;
      uStack_15a8 = uStack_1708;
      *local_16a0 = auVar6;
      local_16a0 = local_16a0 + 1;
      local_1420 = local_12c0._0_8_;
      uStack_1418 = local_12c0._8_8_;
      uStack_1410 = auStack_12b0._0_8_;
      uStack_1408 = auStack_12b0._8_8_;
      local_1400 = uVar7;
      uStack_13f8 = uVar8;
      uStack_13f0 = uVar9;
      uStack_13e8 = uStack_15c8;
      local_131c = local_1320;
      local_1318 = local_1320;
      local_1314 = local_1320;
      local_1310 = local_1320;
      local_130c = local_1320;
      local_1308 = local_1320;
      local_1304 = local_1320;
      local_12dc = local_12e0;
      local_12d8 = local_12e0;
      local_12d4 = local_12e0;
      local_12d0 = local_12e0;
      local_12cc = local_12e0;
      local_12c8 = local_12e0;
      local_12c4 = local_12e0;
      local_129c = local_12a0;
      local_1298 = local_12a0;
      local_1294 = local_12a0;
      local_1290 = local_12a0;
      local_128c = local_12a0;
      local_1288 = local_12a0;
      local_1284 = local_12a0;
      _local_1220 = local_1260;
      _local_1140 = auVar4;
      local_10c0 = local_7c0._0_8_;
      uStack_10b8 = local_7c0._8_8_;
      uStack_10b0 = local_7d0._0_8_;
      uStack_10a8 = local_7d0._8_8_;
      local_1060 = local_1080;
      uStack_1058 = uStack_1078;
      uStack_1050 = uStack_1070;
      uStack_1048 = uStack_1068;
      local_fe0 = local_1000;
      local_e90 = local_f38;
      local_e88 = local_f28;
      local_df0 = local_f38;
      local_de8 = local_f28;
      local_d50 = local_f38;
      local_d48 = local_f28;
      local_cb0 = local_f38;
      local_ca8 = local_f28;
      local_c10 = local_f38;
      local_c08 = local_f28;
      local_b68 = local_f38;
      local_b40 = uVar10;
      uStack_b38 = uVar11;
      uStack_b30 = uVar12;
      uStack_b28 = uVar13;
      local_a98 = local_f38;
      local_9f8 = local_f38;
      local_9e8 = local_a88;
      local_980 = local_1160;
      uStack_978 = uStack_1158;
      uStack_970 = uStack_1150;
      uStack_968 = uStack_1148;
    }
    for (; local_14d8 = local_1638, local_16c8 = local_1538, local_16f8 + 3 < local_1690;
        local_16f8 = local_16f8 + 4) {
      local_1588 = local_16a0;
      local_1560 = *(undefined8 *)*local_16a0;
      uStack_1558 = *(undefined8 *)(*local_16a0 + 8);
      local_694 = 0x3f800000;
      local_6b0 = 0x3f800000;
      local_1570 = 0x3f8000003f800000;
      uStack_1568 = 0x3f8000003f800000;
      local_6b4 = 0x40000000;
      local_6d0 = 0x40000000;
      local_1580 = 0x4000000040000000;
      uStack_1578 = 0x4000000040000000;
      local_640._0_4_ = (float)local_1560;
      local_640._4_4_ = (float)((ulong)local_1560 >> 0x20);
      uStack_638._0_4_ = (float)uStack_1558;
      uStack_638._4_4_ = (float)((ulong)uStack_1558 >> 0x20);
      local_620 = (float)local_640 * 2.0;
      fStack_61c = local_640._4_4_ * 2.0;
      fStack_618 = (float)uStack_638 * 2.0;
      fStack_614 = uStack_638._4_4_ * 2.0;
      local_5f4 = 0x3f800000;
      local_610 = 0x3f800000;
      local_630 = 0x3f8000003f800000;
      uStack_628 = 0x3f8000003f800000;
      local_5c0._8_8_ = 0x3f8000003f800000;
      local_5c0._0_8_ = 0x3f8000003f800000;
      local_410 = ZEXT816(0) << 0x20;
      local_5e0 = 0;
      local_400._8_8_ = SUB168(ZEXT816(0),4);
      uStack_5d8 = local_400._8_8_;
      local_5f0 = CONCAT44(fStack_61c,local_620);
      uStack_5e8 = CONCAT44(fStack_614,fStack_618);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_400._8_8_;
      auVar21._8_8_ = uStack_5e8;
      auVar21._0_8_ = local_5f0;
      auVar2 = vsubps_avx(auVar33 << 0x40,auVar21);
      local_560 = 0x3f8000003f800000;
      uStack_558 = 0x3f8000003f800000;
      local_520._0_8_ = auVar2._0_8_;
      local_3e0 = local_520._0_8_;
      local_520._8_8_ = auVar2._8_8_;
      uStack_3d8 = local_520._8_8_;
      local_3f0 = 0x42b0c0a542b0c0a5;
      uStack_3e8 = 0x42b0c0a542b0c0a5;
      auVar25._8_8_ = 0x42b0c0a542b0c0a5;
      auVar25._0_8_ = 0x42b0c0a542b0c0a5;
      auVar2 = vminps_avx(auVar2,auVar25);
      local_520._0_8_ = auVar2._0_8_;
      local_3c0 = local_520._0_8_;
      local_520._8_8_ = auVar2._8_8_;
      uStack_3b8 = local_520._8_8_;
      local_3d0 = 0xc2b0c0a5c2b0c0a5;
      uStack_3c8 = 0xc2b0c0a5c2b0c0a5;
      auVar26._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar2,auVar26);
      local_520._0_8_ = auVar3._0_8_;
      uVar7 = local_520._0_8_;
      local_520._8_8_ = auVar3._8_8_;
      uVar8 = local_520._8_8_;
      local_470 = 0x3fb8aa3b3fb8aa3b;
      uStack_468 = 0x3fb8aa3b3fb8aa3b;
      local_460._0_4_ = auVar3._0_4_;
      local_460._4_4_ = auVar3._4_4_;
      uStack_458._0_4_ = auVar3._8_4_;
      uStack_458._4_4_ = auVar3._12_4_;
      local_540._4_4_ = local_460._4_4_ * 1.442695;
      local_540._0_4_ = (float)local_460 * 1.442695;
      uStack_538._0_4_ = (float)uStack_458 * 1.442695;
      uStack_538._4_4_ = uStack_458._4_4_ * 1.442695;
      local_420 = local_540;
      uStack_418 = uStack_538;
      local_430 = 0x3f0000003f000000;
      uStack_428 = 0x3f0000003f000000;
      local_540._0_4_ = (float)local_460 * 1.442695 + 0.5;
      local_540._4_4_ = local_460._4_4_ * 1.442695 + 0.5;
      fVar34 = (float)uStack_458 * 1.442695 + 0.5;
      fVar35 = uStack_458._4_4_ * 1.442695 + 0.5;
      uStack_538._0_4_ = fVar34;
      uStack_538._4_4_ = fVar35;
      local_3a0 = local_540;
      uStack_398 = uStack_538;
      local_550._4_4_ = (int)(float)local_540._4_4_;
      local_550._0_4_ = (int)(float)local_540._0_4_;
      local_550._8_4_ = (int)fVar34;
      local_550._12_4_ = (int)fVar35;
      local_390 = local_550._0_8_;
      uStack_388 = local_550._8_8_;
      auVar27._8_8_ = local_550._8_8_;
      auVar27._0_8_ = local_550._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar27);
      local_530 = auVar1._0_8_;
      local_370 = local_530;
      uStack_528 = auVar1._8_8_;
      uStack_368 = uStack_528;
      local_380 = local_540;
      uStack_378 = uStack_538;
      auVar28._8_8_ = uStack_538;
      auVar28._0_8_ = local_540;
      auVar2 = vcmpps_avx(auVar28,auVar1,1);
      local_570._0_8_ = auVar2._0_8_;
      local_350 = local_570._0_8_;
      local_570._8_8_ = auVar2._8_8_;
      uStack_348 = local_570._8_8_;
      local_360 = 0x3f8000003f800000;
      uStack_358 = 0x3f8000003f800000;
      auVar29._8_8_ = 0x3f8000003f800000;
      auVar29._0_8_ = 0x3f8000003f800000;
      local_570 = vpand_avx(auVar2,auVar29);
      local_4c0 = local_530;
      uStack_4b8 = uStack_528;
      local_4d0 = local_570._0_8_;
      uStack_4c8 = local_570._8_8_;
      _local_540 = vsubps_avx(auVar1,local_570);
      local_328 = local_540;
      local_2d0 = ::_ps_cephes_exp_C1;
      local_338 = local_520;
      local_2b0 = local_520._0_8_;
      uStack_2a8 = local_520._8_8_;
      local_2a0[0] = 0.6933594;
      local_2a0[1] = 0.6933594;
      afStack_298[0] = 0.6933594;
      afStack_298[1] = 0.6933594;
      local_290._0_4_ = local_540._0_4_;
      local_290._4_4_ = local_540._4_4_;
      uStack_288._0_4_ = local_540._8_4_;
      uStack_288._4_4_ = local_540._12_4_;
      local_2c0 = (float)local_290 * 0.6933594;
      fStack_2bc = local_290._4_4_ * 0.6933594;
      fStack_2b8 = (float)uStack_288 * 0.6933594;
      fStack_2b4 = uStack_288._4_4_ * 0.6933594;
      auVar31._4_4_ = fStack_2bc;
      auVar31._0_4_ = local_2c0;
      auVar31._8_4_ = fStack_2b8;
      auVar31._12_4_ = fStack_2b4;
      auVar2 = vsubps_avx(auVar3,auVar31);
      local_330 = ::_ps_cephes_exp_C2;
      local_520._0_8_ = auVar2._0_8_;
      local_310 = local_520._0_8_;
      local_520._8_8_ = auVar2._8_8_;
      uStack_308 = local_520._8_8_;
      local_2f0 = local_540;
      uStack_2e8 = uStack_538;
      local_300[0] = -0.00021219444;
      local_300[1] = -0.00021219444;
      afStack_2f8[0] = -0.00021219444;
      afStack_2f8[1] = -0.00021219444;
      local_320 = (float)local_290 * -0.00021219444;
      fStack_31c = local_290._4_4_ * -0.00021219444;
      fStack_318 = (float)uStack_288 * -0.00021219444;
      fStack_314 = uStack_288._4_4_ * -0.00021219444;
      auVar30._4_4_ = fStack_31c;
      auVar30._0_4_ = local_320;
      auVar30._8_4_ = fStack_318;
      auVar30._12_4_ = fStack_314;
      local_520 = vsubps_avx(auVar2,auVar30);
      local_490 = local_520._0_8_;
      uStack_488 = local_520._8_8_;
      local_480._0_4_ = local_520._0_4_;
      local_480._4_4_ = local_520._4_4_;
      uStack_478._0_4_ = local_520._8_4_;
      uStack_478._4_4_ = local_520._12_4_;
      local_530 = CONCAT44(local_480._4_4_ * local_480._4_4_,(float)local_480 * (float)local_480);
      uStack_528._0_4_ = (float)uStack_478 * (float)uStack_478;
      uStack_528._4_4_ = uStack_478._4_4_ * uStack_478._4_4_;
      local_268 = &local_580;
      local_98 = ::_ps_cephes_exp_p1;
      local_70 = 0x3950696739506967;
      uStack_68 = 0x3950696739506967;
      local_80 = local_520._0_8_;
      uStack_78 = local_520._8_8_;
      local_50 = (float)local_480 * 0.00019875691;
      fStack_4c = local_480._4_4_ * 0.00019875691;
      fStack_48 = (float)uStack_478 * 0.00019875691;
      fStack_44 = uStack_478._4_4_ * 0.00019875691;
      local_60[0] = 0.0013981999;
      local_60[1] = 0.0013981999;
      afStack_58[0] = 0.0013981999;
      afStack_58[1] = 0.0013981999;
      local_f8 = ::_ps_cephes_exp_p2;
      local_d0 = CONCAT44(fStack_4c + 0.0013981999,local_50 + 0.0013981999);
      uStack_c8 = CONCAT44(fStack_44 + 0.0013981999,fStack_48 + 0.0013981999);
      local_e0 = local_520._0_8_;
      uStack_d8 = local_520._8_8_;
      local_b0 = (local_50 + 0.0013981999) * (float)local_480;
      fStack_ac = (fStack_4c + 0.0013981999) * local_480._4_4_;
      fStack_a8 = (fStack_48 + 0.0013981999) * (float)uStack_478;
      fStack_a4 = (fStack_44 + 0.0013981999) * uStack_478._4_4_;
      local_c0[0] = 0.008333452;
      local_c0[1] = 0.008333452;
      afStack_b8[0] = 0.008333452;
      afStack_b8[1] = 0.008333452;
      local_158 = ::_ps_cephes_exp_p3;
      local_130 = CONCAT44(fStack_ac + 0.008333452,local_b0 + 0.008333452);
      uStack_128 = CONCAT44(fStack_a4 + 0.008333452,fStack_a8 + 0.008333452);
      local_140 = local_520._0_8_;
      uStack_138 = local_520._8_8_;
      local_110 = (local_b0 + 0.008333452) * (float)local_480;
      fStack_10c = (fStack_ac + 0.008333452) * local_480._4_4_;
      fStack_108 = (fStack_a8 + 0.008333452) * (float)uStack_478;
      fStack_104 = (fStack_a4 + 0.008333452) * uStack_478._4_4_;
      local_120[0] = 0.041665796;
      local_120[1] = 0.041665796;
      afStack_118[0] = 0.041665796;
      afStack_118[1] = 0.041665796;
      local_1b8 = ::_ps_cephes_exp_p4;
      local_190 = CONCAT44(fStack_10c + 0.041665796,local_110 + 0.041665796);
      uStack_188 = CONCAT44(fStack_104 + 0.041665796,fStack_108 + 0.041665796);
      local_1a0 = local_520._0_8_;
      uStack_198 = local_520._8_8_;
      local_170 = (local_110 + 0.041665796) * (float)local_480;
      fStack_16c = (fStack_10c + 0.041665796) * local_480._4_4_;
      fStack_168 = (fStack_108 + 0.041665796) * (float)uStack_478;
      fStack_164 = (fStack_104 + 0.041665796) * uStack_478._4_4_;
      local_180[0] = 0.16666666;
      local_180[1] = 0.16666666;
      afStack_178[0] = 0.16666666;
      afStack_178[1] = 0.16666666;
      local_218 = ::_ps_cephes_exp_p5;
      local_1f0 = CONCAT44(fStack_16c + 0.16666666,local_170 + 0.16666666);
      uStack_1e8 = CONCAT44(fStack_164 + 0.16666666,fStack_168 + 0.16666666);
      local_200 = local_520._0_8_;
      uStack_1f8 = local_520._8_8_;
      local_1d0 = (local_170 + 0.16666666) * (float)local_480;
      fStack_1cc = (fStack_16c + 0.16666666) * local_480._4_4_;
      fStack_1c8 = (fStack_168 + 0.16666666) * (float)uStack_478;
      fStack_1c4 = (fStack_164 + 0.16666666) * uStack_478._4_4_;
      local_1e0[0] = 0.5;
      local_1e0[1] = 0.5;
      afStack_1d8[0] = 0.5;
      afStack_1d8[1] = 0.5;
      local_270 = &local_530;
      local_250 = CONCAT44(fStack_1cc + 0.5,local_1d0 + 0.5);
      uStack_248 = CONCAT44(fStack_1c4 + 0.5,fStack_1c8 + 0.5);
      local_260 = local_530;
      uStack_258 = uStack_528;
      local_230 = (local_1d0 + 0.5) * (float)local_480 * (float)local_480;
      fStack_22c = (fStack_1cc + 0.5) * local_480._4_4_ * local_480._4_4_;
      fStack_228 = (fStack_1c8 + 0.5) * (float)uStack_478 * (float)uStack_478;
      fStack_224 = (fStack_1c4 + 0.5) * uStack_478._4_4_ * uStack_478._4_4_;
      local_240 = local_520._0_8_;
      uStack_238 = local_520._8_8_;
      local_440 = CONCAT44(fStack_22c + local_480._4_4_,local_230 + (float)local_480);
      uStack_438 = CONCAT44(fStack_224 + uStack_478._4_4_,fStack_228 + (float)uStack_478);
      local_450 = 0x3f8000003f800000;
      uStack_448 = 0x3f8000003f800000;
      local_580 = local_230 + (float)local_480 + 1.0;
      fStack_57c = fStack_22c + local_480._4_4_ + 1.0;
      fStack_578 = fStack_228 + (float)uStack_478 + 1.0;
      fStack_574 = fStack_224 + uStack_478._4_4_ + 1.0;
      local_3b0 = local_540;
      uStack_3a8 = uStack_538;
      local_550._4_4_ = (int)local_290._4_4_;
      local_550._0_4_ = (int)(float)local_290;
      local_550._8_4_ = (int)(float)uStack_288;
      local_550._12_4_ = (int)uStack_288._4_4_;
      local_500 = local_550._0_8_;
      uStack_4f8 = local_550._8_8_;
      local_510 = 0x7f0000007f;
      uStack_508 = 0x7f0000007f;
      auVar24._8_8_ = local_550._8_8_;
      auVar24._0_8_ = local_550._0_8_;
      auVar23._8_8_ = 0x7f0000007f;
      auVar23._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar24,auVar23);
      local_550._0_8_ = auVar2._0_8_;
      local_4e0 = local_550._0_8_;
      local_550._8_8_ = auVar2._8_8_;
      uStack_4d8 = local_550._8_8_;
      local_4e4 = 0x17;
      local_550 = vpslld_avx(auVar2,ZEXT416(0x17));
      local_40 = local_550._0_8_;
      uStack_38 = local_550._8_8_;
      local_590 = local_550._0_8_;
      uStack_588 = local_550._8_8_;
      local_4a0._4_4_ = fStack_57c;
      local_4a0._0_4_ = local_580;
      local_4a0._8_4_ = fStack_578;
      local_4a0._12_4_ = fStack_574;
      local_4b0._0_4_ = local_550._0_4_;
      local_4b0._4_4_ = local_550._4_4_;
      uStack_4a8._0_4_ = local_550._8_4_;
      uStack_4a8._4_4_ = local_550._12_4_;
      local_580 = local_580 * (float)local_4b0;
      fStack_57c = fStack_57c * local_4b0._4_4_;
      fStack_578 = fStack_578 * (float)uStack_4a8;
      fStack_574 = fStack_574 * uStack_4a8._4_4_;
      local_5b0 = CONCAT44(fStack_57c,local_580);
      uStack_5a8 = CONCAT44(fStack_574,fStack_578);
      local_5d0 = local_580 + 1.0;
      fStack_5cc = fStack_57c + 1.0;
      fStack_5c8 = fStack_578 + 1.0;
      fStack_5c4 = fStack_574 + 1.0;
      auVar22._4_4_ = fStack_5cc;
      auVar22._0_4_ = local_5d0;
      auVar22._8_4_ = fStack_5c8;
      auVar22._12_4_ = fStack_5c4;
      _local_660 = vdivps_avx(local_5c0,auVar22);
      local_680._0_4_ = (float)local_660._0_4_ * 2.0;
      local_680._4_4_ = (float)local_660._4_4_ * 2.0;
      local_680._8_4_ = fStack_658 * 2.0;
      local_680._12_4_ = fStack_654 * 2.0;
      auVar20._8_8_ = 0x3f8000003f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar2 = vsubps_avx(local_680,auVar20);
      local_1540 = local_16a0;
      local_1730 = auVar2._0_8_;
      local_1550 = local_1730;
      uStack_1728 = auVar2._8_8_;
      uStack_1548 = uStack_1728;
      *(undefined1 (*) [16])*local_16a0 = auVar2;
      local_16a0 = (undefined1 (*) [32])(*local_16a0 + 0x10);
      uStack_6cc = local_6d0;
      uStack_6c8 = local_6d0;
      uStack_6c4 = local_6d0;
      uStack_6ac = local_6b0;
      uStack_6a8 = local_6b0;
      uStack_6a4 = local_6b0;
      local_690 = local_1570;
      uStack_688 = uStack_1568;
      local_670 = local_1580;
      uStack_668 = uStack_1578;
      local_650 = local_1580;
      uStack_648 = uStack_1578;
      local_640 = local_1560;
      uStack_638 = uStack_1558;
      uStack_60c = local_610;
      uStack_608 = local_610;
      uStack_604 = local_610;
      local_5a0 = local_5c0;
      local_4b0 = local_550._0_8_;
      uStack_4a8 = local_550._8_8_;
      local_480 = local_490;
      uStack_478 = uStack_488;
      local_460 = uVar7;
      uStack_458 = uVar8;
      local_400 = local_410;
      local_2d8 = local_338;
      local_2c8 = local_328;
      local_290 = local_540;
      uStack_288 = uStack_538;
      local_278 = local_338;
      local_210 = local_338;
      local_208 = local_268;
      local_1b0 = local_338;
      local_1a8 = local_268;
      local_150 = local_338;
      local_148 = local_268;
      local_f0 = local_338;
      local_e8 = local_268;
      local_90 = local_338;
      local_88 = local_268;
    }
    for (; local_16f8 < local_1690; local_16f8 = local_16f8 + 1) {
      fVar34 = tanhf(*(float *)*local_16a0);
      *(float *)*local_16a0 = fVar34;
      local_16a0 = (undefined1 (*) [32])(*local_16a0 + 4);
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}